

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O2

void __thiscall
slang::ast::InsideExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (InsideExpression *this,MonitorVisitor *visitor)

{
  pointer ppEVar1;
  size_type sVar2;
  long lVar3;
  
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->left_,visitor);
  ppEVar1 = (this->rangeList_).data_;
  sVar2 = (this->rangeList_).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::builtins::MonitorVisitor&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        left().visit(visitor);
        for (auto range : rangeList())
            range->visit(visitor);
    }